

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddKmap.c
# Opt level: O0

void Extra_PrintKMapRelation
               (FILE *Output,DdManager *dd,DdNode *OnSet,DdNode *OffSet,int nXVars,int nYVars,
               DdNode **XVars,DdNode **YVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DdNode *n_00;
  DdNode *pDVar6;
  DdNode *n_01;
  DdNode *n_02;
  byte bVar7;
  DdNode *ValueOffSet;
  DdNode *ValueOnSet;
  DdNode *Prod;
  DdNode *CubeHorBDD;
  DdNode *CubeVerBDD;
  int nSkipSpaces;
  int nCellsHor;
  int nCellsVer;
  int nVarsHor;
  int nVarsVer;
  int nVars;
  int w;
  int h;
  int v;
  int s;
  int n;
  int p;
  int d;
  int nYVars_local;
  int nXVars_local;
  DdNode *OffSet_local;
  DdNode *OnSet_local;
  DdManager *dd_local;
  FILE *Output_local;
  
  iVar1 = Cudd_bddLeq(dd,OnSet,(DdNode *)((ulong)OffSet ^ 1));
  if (iVar1 == 0) {
    fprintf((FILE *)Output,"PrintKMap(): The on-set and the off-set overlap\n");
  }
  else if (OnSet == dd->one) {
    fprintf((FILE *)Output,"PrintKMap(): Constant 1\n");
  }
  else if (OffSet == dd->one) {
    fprintf((FILE *)Output,"PrintKMap(): Constant 0\n");
  }
  else if ((nXVars + nYVars < 0) || (0x14 < nXVars + nYVars)) {
    fprintf((FILE *)Output,
            "PrintKMap(): The number of variables is less than zero or more than %d\n",0x14);
  }
  else {
    iVar1 = 1 << ((byte)nXVars & 0x1f);
    bVar7 = (byte)nYVars;
    iVar2 = 1 << (bVar7 & 0x1f);
    iVar3 = nXVars + 1;
    fprintf((FILE *)Output,"\n");
    for (nVarsVer = 0; nVarsVer < nXVars; nVarsVer = nVarsVer + 1) {
      fprintf((FILE *)Output,"%c",(ulong)(uint)(nYVars + 0x61 + nVarsVer));
    }
    if (fHorizontalVarNamesPrintedAbove != 0) {
      fprintf((FILE *)Output," \\ ");
      for (nVarsVer = 0; nVarsVer < nYVars; nVarsVer = nVarsVer + 1) {
        fprintf((FILE *)Output,"%c",(ulong)(nVarsVer + 0x61));
      }
    }
    fprintf((FILE *)Output,"\n");
    if (fHorizontalVarNamesPrintedAbove != 0) {
      for (n = 0; n < nYVars; n = n + 1) {
        s = 0;
        while (s < nXVars + 3) {
          s = s + 1;
          fprintf((FILE *)Output," ");
        }
        for (v = 0; v < iVar2; v = v + 1) {
          uVar4 = GrayCode(v);
          if ((uVar4 & 1 << ((bVar7 - 1) - (char)n & 0x1f)) == 0) {
            fprintf((FILE *)Output,"0   ");
          }
          else {
            fprintf((FILE *)Output,"1   ");
          }
        }
        fprintf((FILE *)Output,"\n");
      }
    }
    s = 0;
    while (s < iVar3) {
      s = s + 1;
      fprintf((FILE *)Output," ");
    }
    fprintf((FILE *)Output,"%c",0x2b);
    for (h = 0; h < iVar2; h = h + 1) {
      fprintf((FILE *)Output,"%c",0x2d);
      fprintf((FILE *)Output,"%c",0x2d);
      fprintf((FILE *)Output,"%c",0x2d);
      if (h != iVar2 + -1) {
        if ((h & 1U) == 0) {
          fprintf((FILE *)Output,"%c",0x2b);
        }
        else {
          fprintf((FILE *)Output,"%c",0x2b);
        }
      }
    }
    fprintf((FILE *)Output,"%c",0x2b);
    fprintf((FILE *)Output,"\n");
    for (w = 0; w < iVar1; w = w + 1) {
      for (v = 0; v < nXVars; v = v + 1) {
        uVar4 = GrayCode(w);
        if ((uVar4 & 1 << (((byte)nXVars - 1) - (char)v & 0x1f)) == 0) {
          fprintf((FILE *)Output,"0");
        }
        else {
          fprintf((FILE *)Output,"1");
        }
      }
      fprintf((FILE *)Output," ");
      iVar5 = GrayCode(w);
      n_00 = Extra_bddBitsToCube(dd,iVar5,nXVars,XVars,1);
      Cudd_Ref(n_00);
      fprintf((FILE *)Output,"%c",0x7c);
      for (nVars = 0; nVars < iVar2; nVars = nVars + 1) {
        fprintf((FILE *)Output," ");
        iVar5 = GrayCode(nVars);
        pDVar6 = Extra_bddBitsToCube(dd,iVar5,nYVars,YVars,1);
        Cudd_Ref(pDVar6);
        n_01 = Cudd_bddAnd(dd,pDVar6,n_00);
        Cudd_Ref(n_01);
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar6 = Cudd_Cofactor(dd,OnSet,n_01);
        Cudd_Ref(pDVar6);
        n_02 = Cudd_Cofactor(dd,OffSet,n_01);
        Cudd_Ref(n_02);
        Cudd_RecursiveDeref(dd,n_01);
        if ((pDVar6 == dd->one) && (n_02 == (DdNode *)((ulong)dd->one ^ 1))) {
          fprintf((FILE *)Output,"%c",0x31);
        }
        else if ((pDVar6 == (DdNode *)((ulong)dd->one ^ 1)) && (n_02 == dd->one)) {
          fprintf((FILE *)Output,"%c",0x20);
        }
        else if ((pDVar6 == (DdNode *)((ulong)dd->one ^ 1)) &&
                (n_02 == (DdNode *)((ulong)dd->one ^ 1))) {
          fprintf((FILE *)Output,"%c",0x2d);
        }
        else {
          if ((pDVar6 != dd->one) || (n_02 != dd->one)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddKmap.c"
                          ,0x2d9,
                          "void Extra_PrintKMapRelation(FILE *, DdManager *, DdNode *, DdNode *, int, int, DdNode **, DdNode **)"
                         );
          }
          fprintf((FILE *)Output,"%c",0x3f);
        }
        Cudd_RecursiveDeref(dd,pDVar6);
        Cudd_RecursiveDeref(dd,n_02);
        fprintf((FILE *)Output," ");
        if (nVars != iVar2 + -1) {
          if ((nVars & 1U) == 0) {
            fprintf((FILE *)Output,"%c",0x7c);
          }
          else {
            fprintf((FILE *)Output,"%c",0x7c);
          }
        }
      }
      fprintf((FILE *)Output,"%c",0x7c);
      fprintf((FILE *)Output,"\n");
      Cudd_RecursiveDeref(dd,n_00);
      if (w != iVar1 + -1) {
        s = 0;
        while (s < iVar3) {
          s = s + 1;
          fprintf((FILE *)Output," ");
        }
        if ((w & 1U) == 0) {
          fprintf((FILE *)Output,"%c",0x2b);
          for (h = 0; h < iVar2; h = h + 1) {
            fprintf((FILE *)Output,"%c",0x2d);
            fprintf((FILE *)Output,"%c",0x2d);
            fprintf((FILE *)Output,"%c",0x2d);
            if (h != iVar2 + -1) {
              if ((h & 1U) == 0) {
                fprintf((FILE *)Output,"%c",0x2b);
              }
              else {
                fprintf((FILE *)Output,"%c",0x2b);
              }
            }
          }
          fprintf((FILE *)Output,"%c",0x2b);
        }
        else {
          fprintf((FILE *)Output,"%c",0x2b);
          for (h = 0; h < iVar2; h = h + 1) {
            fprintf((FILE *)Output,"%c",0x2d);
            fprintf((FILE *)Output,"%c",0x2d);
            fprintf((FILE *)Output,"%c",0x2d);
            if (h != iVar2 + -1) {
              if ((h & 1U) == 0) {
                fprintf((FILE *)Output,"%c",0x2b);
              }
              else {
                fprintf((FILE *)Output,"%c",0x2b);
              }
            }
          }
          fprintf((FILE *)Output,"%c",0x2b);
        }
        fprintf((FILE *)Output,"\n");
      }
    }
    s = 0;
    while (s < iVar3) {
      s = s + 1;
      fprintf((FILE *)Output," ");
    }
    fprintf((FILE *)Output,"%c",0x2b);
    for (h = 0; h < iVar2; h = h + 1) {
      fprintf((FILE *)Output,"%c",0x2d);
      fprintf((FILE *)Output,"%c",0x2d);
      fprintf((FILE *)Output,"%c",0x2d);
      if (h != iVar2 + -1) {
        if ((h & 1U) == 0) {
          fprintf((FILE *)Output,"%c",0x2b);
        }
        else {
          fprintf((FILE *)Output,"%c",0x2b);
        }
      }
    }
    fprintf((FILE *)Output,"%c",0x2b);
    fprintf((FILE *)Output,"\n");
    if (fHorizontalVarNamesPrintedAbove == 0) {
      for (n = 0; n < nYVars; n = n + 1) {
        s = 0;
        while (s < nXVars + 3) {
          s = s + 1;
          fprintf((FILE *)Output," ");
        }
        for (v = 0; v < iVar2; v = v + 1) {
          uVar4 = GrayCode(v);
          if ((uVar4 & 1 << ((bVar7 - 1) - (char)n & 0x1f)) == 0) {
            fprintf((FILE *)Output,"0   ");
          }
          else {
            fprintf((FILE *)Output,"1   ");
          }
        }
        fprintf((FILE *)Output,"%c",(ulong)(uint)(int)(char)((char)n + 'a'));
        fprintf((FILE *)Output,"\n");
      }
    }
  }
  return;
}

Assistant:

void Extra_PrintKMapRelation( 
  FILE * Output,  /* the output stream */
  DdManager * dd, 
  DdNode * OnSet, 
  DdNode * OffSet, 
  int nXVars, 
  int nYVars, 
  DdNode ** XVars, 
  DdNode ** YVars ) /* the flag which determines how support is computed */
{
    int d, p, n, s, v, h, w;
    int nVars;
    int nVarsVer;
    int nVarsHor;
    int nCellsVer;
    int nCellsHor;
    int nSkipSpaces;

    // make sure that on-set and off-set do not overlap
    if ( !Cudd_bddLeq( dd, OnSet, Cudd_Not(OffSet) ) )
    {
        fprintf( Output, "PrintKMap(): The on-set and the off-set overlap\n" );
        return;
    }

    if ( OnSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 1\n" );
        return;
    }
    if ( OffSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 0\n" );
        return;
    }

    nVars = nXVars + nYVars;
    if ( nVars < 0 || nVars > MAXVARS )
    {
        fprintf( Output, "PrintKMap(): The number of variables is less than zero or more than %d\n", MAXVARS );
        return;
    }


    ////////////////////////////////////////////////////////////////////
    // determine the Karnaugh map parameters
    nVarsVer = nXVars;
    nVarsHor = nYVars;
    nCellsVer = (1<<nVarsVer);
    nCellsHor = (1<<nVarsHor);
    nSkipSpaces = nVarsVer + 1;

    ////////////////////////////////////////////////////////////////////
    // print variable names
    fprintf( Output, "\n" );
    for ( w = 0; w < nVarsVer; w++ )
        fprintf( Output, "%c", 'a'+nVarsHor+w );
    if ( fHorizontalVarNamesPrintedAbove )
    {
        fprintf( Output, " \\ " );
        for ( w = 0; w < nVarsHor; w++ )
            fprintf( Output, "%c", 'a'+w );
    }
    fprintf( Output, "\n" );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );
            fprintf( Output, "\n" );
        }
    }

    ////////////////////////////////////////////////////////////////////
    // print the upper line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_TOP_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_BOT );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_BOT );
        }
    }
    fprintf( Output, "%c", DOUBLE_TOP_RIGHT );
    fprintf( Output, "\n" );

    ////////////////////////////////////////////////////////////////////
    // print the map
    for ( v = 0; v < nCellsVer; v++ )
    {
        DdNode * CubeVerBDD;

        // print horizontal digits
//      for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
        for ( n = 0; n < nVarsVer; n++ )
            if ( GrayCode(v) & (1<<(nVarsVer-1-n)) )
                fprintf( Output, "1" );
            else
                fprintf( Output, "0" );
        fprintf( Output, " " );

        // find vertical cube
//      CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nVarsVer, s_XVars+nVarsHor );    Cudd_Ref( CubeVerBDD );
        CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nXVars, XVars, 1 );                 Cudd_Ref( CubeVerBDD );

        // print text line
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        for ( h = 0; h < nCellsHor; h++ )
        {
            DdNode * CubeHorBDD, * Prod, * ValueOnSet, * ValueOffSet;

            fprintf( Output, " " );
//          fprintf( Output, "x" );
            ///////////////////////////////////////////////////////////////
            // determine what should be printed
//          CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nVarsHor, s_XVars );    Cudd_Ref( CubeHorBDD );
            CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nYVars, YVars, 1 );        Cudd_Ref( CubeHorBDD );
            Prod = Cudd_bddAnd( dd, CubeHorBDD, CubeVerBDD );                           Cudd_Ref( Prod );
            Cudd_RecursiveDeref( dd, CubeHorBDD );

            ValueOnSet  = Cudd_Cofactor( dd, OnSet, Prod );                     Cudd_Ref( ValueOnSet );
            ValueOffSet = Cudd_Cofactor( dd, OffSet, Prod );                    Cudd_Ref( ValueOffSet );
            Cudd_RecursiveDeref( dd, Prod );

            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                fprintf( Output, "%c", SYMBOL_ONE );
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                fprintf( Output, "%c", SYMBOL_ZERO );
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                fprintf( Output, "%c", SYMBOL_DC );
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                fprintf( Output, "%c", SYMBOL_OVERLAP );
            else
                assert(0);

            Cudd_RecursiveDeref( dd, ValueOnSet );
            Cudd_RecursiveDeref( dd, ValueOffSet );
            ///////////////////////////////////////////////////////////////
            fprintf( Output, " " );

            if ( h != nCellsHor-1 )
            {
                if ( h&1 )
                    fprintf( Output, "%c", DOUBLE_VERTICAL );
                else
                    fprintf( Output, "%c", SINGLE_VERTICAL );
            }
        }
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        fprintf( Output, "\n" );

        Cudd_RecursiveDeref( dd, CubeVerBDD );

        if ( v != nCellsVer-1 )
        // print separator line
        {
            for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
            if ( v&1 )
            {
                fprintf( Output, "%c", D_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", DOUBLES_CROSS );
                        else
                            fprintf( Output, "%c", S_VER_CROSS_D_HOR );
                    }
                }
                fprintf( Output, "%c", D_JOINS_D_VER_LEFT );
            }
            else
            {
                fprintf( Output, "%c", S_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", S_HOR_CROSS_D_VER );
                        else
                            fprintf( Output, "%c", SINGLES_CROSS );
                    }
                }
                fprintf( Output, "%c", S_JOINS_D_VER_LEFT );
            }
            fprintf( Output, "\n" );
        }
    }
    
    ////////////////////////////////////////////////////////////////////
    // print the lower line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_BOT_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_TOP );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_TOP );
        }
    }
    fprintf( Output, "%c", DOUBLE_BOT_RIGHT );
    fprintf( Output, "\n" );

    if ( !fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );

            /////////////////////////////////
            fprintf( Output, "%c", (char)('a'+d) );
            /////////////////////////////////
            fprintf( Output, "\n" );
        }
    }
}